

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * cmQtAutoGen::GeneratorName_abi_cxx11_(GenT genType)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_,
                 "AutoGen",&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_);
    }
  }
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_,
                 "AutoMoc",&local_12);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_);
    }
  }
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_,
                 "AutoUic",&local_13);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_);
    }
  }
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_,
                 "AutoRcc",&local_14);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_);
    }
  }
  if (genType - MOC < 3) {
    psVar2 = (string *)(&PTR_AutoMoc_abi_cxx11__005e3630)[genType - MOC];
  }
  else {
    psVar2 = &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorName(GenT genType)
{
  static const std::string AutoGen("AutoGen");
  static const std::string AutoMoc("AutoMoc");
  static const std::string AutoUic("AutoUic");
  static const std::string AutoRcc("AutoRcc");

  switch (genType) {
    case GenT::GEN:
      return AutoGen;
    case GenT::MOC:
      return AutoMoc;
    case GenT::UIC:
      return AutoUic;
    case GenT::RCC:
      return AutoRcc;
  }
  return AutoGen;
}